

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recycling_allocator.hpp
# Opt level: O0

impl<asio::detail::binder2<std::function<void_(const_std::error_code_&,_unsigned_long)>,_std::error_code,_unsigned_long>,_std::allocator<void>_>
* __thiscall
asio::detail::
recycling_allocator<asio::detail::executor_function::impl<asio::detail::binder2<std::function<void_(const_std::error_code_&,_unsigned_long)>,_std::error_code,_unsigned_long>,_std::allocator<void>_>,_asio::detail::thread_info_base::executor_function_tag>
::allocate(recycling_allocator<asio::detail::executor_function::impl<asio::detail::binder2<std::function<void_(const_std::error_code_&,_unsigned_long)>,_std::error_code,_unsigned_long>,_std::allocator<void>_>,_asio::detail::thread_info_base::executor_function_tag>
           *this,size_t n)

{
  thread_info_base *ptVar1;
  impl<asio::detail::binder2<std::function<void_(const_std::error_code_&,_unsigned_long)>,_std::error_code,_unsigned_long>,_std::allocator<void>_>
  *piVar2;
  long in_RSI;
  void *p;
  
  ptVar1 = thread_context::top_of_thread_call_stack();
  piVar2 = (impl<asio::detail::binder2<std::function<void_(const_std::error_code_&,_unsigned_long)>,_std::error_code,_unsigned_long>,_std::allocator<void>_>
            *)thread_info_base::allocate<asio::detail::thread_info_base::executor_function_tag>
                        (ptVar1,in_RSI * 0x48,8);
  return piVar2;
}

Assistant:

T* allocate(std::size_t n)
  {
#if !defined(ASIO_DISABLE_SMALL_BLOCK_RECYCLING)
    void* p = thread_info_base::allocate(Purpose(),
        thread_context::top_of_thread_call_stack(),
        sizeof(T) * n, alignof(T));
#else // !defined(ASIO_DISABLE_SMALL_BLOCK_RECYCLING)
    void* p = asio::aligned_new(align, s);
#endif // !defined(ASIO_DISABLE_SMALL_BLOCK_RECYCLING)
    return static_cast<T*>(p);
  }